

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O3

EStatusCode __thiscall
PDFDocumentHandler::OnResourcesWrite
          (PDFDocumentHandler *this,ResourcesDictionary *inResources,
          DictionaryContext *inPageResourcesDictionaryContext,
          ObjectsContext *inPDFWriterObjectContext,DocumentContext *inPDFWriterDocumentContext)

{
  long ****pppplVar1;
  long ****pppplVar2;
  iteratorType iVar3;
  EStatusCode EVar4;
  PDFObject *inOriginal;
  string *inKey;
  MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  it;
  PDFObjectCastPtr<PDFDictionary> resources;
  OutWritingPolicy writingPolicy;
  ObjectIDTypeList dummyObjectList;
  MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  local_88;
  RefCountPtr<PDFDictionary> local_70;
  IObjectWritePolicy local_60;
  PDFDocumentHandler *local_58;
  long ***local_50;
  long ***local_48;
  long ***local_40;
  undefined8 local_38;
  
  inOriginal = FindPageResources(this,this->mParser,this->mWrittenPage);
  local_70.mValue = PDFObjectCast<PDFDictionary>(inOriginal);
  local_70._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a58a0;
  local_38 = 0;
  local_48 = (long ***)&local_48;
  local_40 = (long ***)&local_48;
  if (local_70.mValue == (PDFDictionary *)0x0) {
    EVar4 = eSuccess;
  }
  else {
    PDFDictionary::GetIterator(&local_88,local_70.mValue);
    local_60._vptr_IObjectWritePolicy = (_func_int **)&PTR_WriteReference_003a80d0;
    EVar4 = eSuccess;
    local_58 = this;
    local_50 = (long ***)&local_48;
    pppplVar2 = (long ****)local_48;
    if (local_88.
        super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
        .mCurrentPosition._M_node !=
        local_88.
        super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
        .mEndPosition._M_node) {
      do {
        iVar3._M_node =
             local_88.
             super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
             .mEndPosition._M_node;
        if (local_88.
            super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
            .mFirstMove == true) {
          local_88.
          super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
          .mFirstMove = false;
          pppplVar2 = (long ****)local_48;
          if (EVar4 != eSuccess) break;
        }
        else {
          local_88.
          super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
          .mCurrentPosition._M_node =
               (_Base_ptr)
               std::_Rb_tree_increment
                         (local_88.
                          super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                          .mCurrentPosition._M_node);
          pppplVar2 = (long ****)local_48;
          if ((EVar4 != eSuccess) ||
             (local_88.
              super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
              .mCurrentPosition._M_node == iVar3._M_node)) break;
        }
        inKey = PDFName::GetValue_abi_cxx11_
                          (*(PDFName **)
                            (local_88.
                             super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                             .mCurrentPosition._M_node + 1));
        EVar4 = DictionaryContext::WriteKey(inPageResourcesDictionaryContext,inKey);
        if (EVar4 == eSuccess) {
          EVar4 = WriteObjectByType(this,(PDFObject *)
                                         local_88.
                                         super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                         .mCurrentPosition._M_node[1]._M_parent,
                                    eTokenSeparatorEndLine,&local_60);
        }
        pppplVar2 = (long ****)local_48;
      } while (local_88.
               super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
               .mCurrentPosition._M_node !=
               local_88.
               super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
               .mEndPosition._M_node);
    }
    while (pppplVar2 != &local_48) {
      pppplVar1 = (long ****)*pppplVar2;
      operator_delete(pppplVar2,0x18);
      pppplVar2 = pppplVar1;
    }
  }
  RefCountPtr<PDFDictionary>::~RefCountPtr(&local_70);
  return EVar4;
}

Assistant:

EStatusCode PDFDocumentHandler::OnResourcesWrite(
						ResourcesDictionary* inResources,
						DictionaryContext* inPageResourcesDictionaryContext,
						ObjectsContext* inPDFWriterObjectContext,
						DocumentContext* inPDFWriterDocumentContext)
{
	// Writing resources dictionary. simply loop internal elements and copy. nicely enough, i can use read methods, trusting
	// that no new objects need be written
	
	PDFObjectCastPtr<PDFDictionary> resources(FindPageResources(mParser, mWrittenPage));
	ObjectIDTypeList dummyObjectList; // this one should remain empty...

	// k. no resources...as wierd as that might be...or just wrong...i'll let it be
	if(!resources)
		return PDFHummus::eSuccess;

	MapIterator<PDFNameToPDFObjectMap> it(resources->GetIterator());
	EStatusCode status = PDFHummus::eSuccess;
	OutWritingPolicy writingPolicy(this, dummyObjectList);

	while(it.MoveNext() && PDFHummus::eSuccess == status)
	{
		status = inPageResourcesDictionaryContext->WriteKey(it.GetKey()->GetValue());
		if(PDFHummus::eSuccess == status)
			status = WriteObjectByType(it.GetValue(),eTokenSeparatorEndLine, &writingPolicy);
	}
	return status;
}